

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.cpp
# Opt level: O1

bool idx2::IsRelative(stref *Path)

{
  if (((Path->Size < 1) || (*(Path->field_0).Ptr != '/')) &&
     ((Path->Size < 3 || (((Path->field_0).Ptr[1] != ':' || ((Path->field_0).Ptr[2] != '/')))))) {
    return true;
  }
  return false;
}

Assistant:

bool
IsRelative(const stref& Path)
{
  stref& PathR = const_cast<stref&>(Path);
  if (PathR.Size > 0 && PathR[0] == '/') // e.g. /usr/local
    return false;
  if (PathR.Size > 2 && PathR[1] == ':' && PathR[2] == '/') // e.g. C:/Users
    return false;

  return true;
}